

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void __thiscall xatlas::internal::segment::CostQueue::push(CostQueue *this,float cost,uint32_t face)

{
  Array<xatlas::internal::segment::CostQueue::Pair> *this_00;
  float *pfVar1;
  uint uVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  ulong uVar5;
  Pair p;
  float local_18;
  uint32_t local_14;
  
  _local_18 = CONCAT44(face,cost);
  this_00 = &this->m_pairs;
  uVar2 = (this->m_pairs).m_base.size;
  if ((ulong)uVar2 != 0) {
    uVar3 = (this->m_pairs).m_base.size;
    if (uVar3 == 0) {
      __assert_fail("!isEmpty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                    ,0x4b4,
                    "const T &xatlas::internal::Array<xatlas::internal::segment::CostQueue::Pair>::back() const [T = xatlas::internal::segment::CostQueue::Pair]"
                   );
    }
    puVar4 = (this_00->m_base).buffer;
    if (*(float *)(puVar4 + (ulong)(uVar3 - 1) * 8) <= cost) {
      uVar5 = 0;
      do {
        pfVar1 = (float *)(puVar4 + uVar5 * 8);
        if (*pfVar1 <= cost && cost != *pfVar1) goto LAB_001b2da9;
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
      uVar5 = (ulong)uVar2;
LAB_001b2da9:
      ArrayBase::insertAt(&this_00->m_base,(uint32_t)uVar5,(uint8_t *)&local_18);
      if ((this->m_pairs).m_base.size <= this->m_maxSize) {
        return;
      }
      ArrayBase::removeAt(&this_00->m_base,0);
      return;
    }
  }
  ArrayBase::push_back(&this_00->m_base,(uint8_t *)&local_18);
  return;
}

Assistant:

void push(float cost, uint32_t face)
	{
		const Pair p = { cost, face };
		if (m_pairs.isEmpty() || cost < peekCost())
			m_pairs.push_back(p);
		else {
			uint32_t i = 0;
			const uint32_t count = m_pairs.size();
			for (; i < count; i++) {
				if (m_pairs[i].cost < cost)
					break;
			}
			m_pairs.insertAt(i, p);
			if (m_pairs.size() > m_maxSize)
				m_pairs.removeAt(0);
		}
	}